

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalDelete::Sink
          (PhysicalDelete *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  DataChunk *this_00;
  bool *__value;
  __pthread_list_t *p_Var1;
  TableIndexList *__mutex;
  GlobalSinkState *pGVar2;
  LocalSinkState *pLVar3;
  pointer puVar4;
  DataTable *pDVar5;
  long lVar6;
  pointer pSVar7;
  optional_ptr<duckdb::LocalTableStorage,_true> oVar8;
  pointer pVVar9;
  int iVar10;
  DuckTransaction *transaction;
  reference row_identifiers;
  element_type **ppeVar11;
  type pIVar12;
  Allocator *allocator;
  idx_t iVar13;
  reference pvVar14;
  reference other;
  reference pvVar15;
  LocalStorage *pLVar16;
  BoundIndex *this_01;
  type pTVar17;
  InternalException *pIVar18;
  ulong uVar19;
  _Hash_node_base *p_Var20;
  pointer pSVar21;
  size_type __n;
  pointer puVar22;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  element_type **ppeVar23;
  ulong uVar24;
  vector<bool,_true> to_be_fetched;
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::LogicalType,_true> column_types;
  optional_ptr<duckdb::LocalTableStorage,_true> storage_1;
  IndexAppendInfo index_append_info;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  ColumnFetchState fetch_state;
  DataChunk fetch_chunk;
  vector<bool,_std::allocator<bool>_> local_240;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_218;
  pthread_mutex_t *local_200;
  pthread_mutex_t *local_1f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1d8;
  bool *local_1b8;
  optional_ptr<duckdb::LocalTableStorage,_true> local_1b0;
  IndexAppendInfo local_1a8;
  undefined1 local_198 [24];
  undefined1 auStack_180 [24];
  element_type *peStack_168;
  undefined1 local_160 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_150 [56];
  undefined1 local_118 [32];
  _Prime_rehash_policy local_f8;
  __node_base_ptr local_e8;
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  vStack_e0;
  DataChunk local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  LogicalType local_48;
  
  pGVar2 = input->global_state;
  pLVar3 = input->local_state;
  transaction = DuckTransaction::Get(context->client,this->table->db);
  row_identifiers = vector<duckdb::Vector,_true>::operator[](&chunk->data,this->row_id_index);
  local_1f8 = (pthread_mutex_t *)(pGVar2 + 1);
  iVar10 = pthread_mutex_lock(local_1f8);
  if (iVar10 != 0) {
    ::std::__throw_system_error(iVar10);
  }
  if ((this->return_chunk == false) && (pGVar2[5].state == READY)) {
    pDVar5 = this->table;
    pTVar17 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
              ::operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)&pLVar3[2].partition_info.min_batch_index);
    iVar13 = DataTable::Delete(pDVar5,pTVar17,context->client,row_identifiers,chunk->count);
    p_Var1 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + iVar13);
  }
  else {
    DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)&local_1f0,this->table);
    __value = &this->return_chunk;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              (&local_240,
               ((long)local_1f0.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1f0.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,__value,
               (allocator_type *)local_198);
    local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8 = __value;
    if (*__value == true) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&local_1d8,&local_1f0);
      ppeVar23 = (element_type **)0x0;
      while( true ) {
        local_198._0_8_ = ppeVar23;
        ppeVar11 = (element_type **)DataTable::ColumnCount(this->table);
        if (ppeVar11 <= ppeVar23) break;
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long&>
                  ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_218,
                   (unsigned_long *)local_198);
        ppeVar23 = (element_type **)(local_198._0_8_ + 1);
      }
    }
    else {
      pLVar16 = LocalStorage::Get(context->client,this->table->db);
      local_c8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)LocalStorage::GetStorage(pLVar16,this->table);
      local_198._0_8_ = &peStack_168;
      local_198._8_8_ = &DAT_00000001;
      local_198._16_8_ = (_Hash_node_base *)0x0;
      auStack_180._0_8_ = (_func_int **)0x0;
      auStack_180._8_4_ = 1.0;
      auStack_180._16_8_ = (undefined1 *)0x0;
      peStack_168 = (element_type *)0x0;
      optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid
                ((optional_ptr<duckdb::LocalTableStorage,_true> *)&local_c8);
      pVVar9 = local_c8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      __mutex = (TableIndexList *)
                ((long)local_c8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x70);
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar10 != 0) {
        ::std::__throw_system_error(iVar10);
      }
      puVar22 = (((TableIndexList *)((long)pVVar9 + 0x70))->indexes).
                super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (((TableIndexList *)((long)pVVar9 + 0x70))->indexes).
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar22 != puVar4) {
        do {
          pIVar12 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (puVar22);
          iVar10 = (*pIVar12->_vptr_Index[2])(pIVar12);
          if ((char)iVar10 != '\0') {
            iVar10 = (*pIVar12->_vptr_Index[5])(pIVar12);
            if ((byte)((char)iVar10 - 1U) < 2) {
              local_118._0_8_ = (allocator_type *)local_198;
              for (p_Var20 = (pIVar12->column_id_set)._M_h._M_before_begin._M_nxt;
                  p_Var20 != (_Hash_node_base *)0x0; p_Var20 = p_Var20->_M_nxt) {
                ::std::
                _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                          ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_198,p_Var20 + 1,local_118);
              }
            }
          }
          puVar22 = puVar22 + 1;
        } while (puVar22 != puVar4);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if ((_Hash_node_base *)local_198._16_8_ != (_Hash_node_base *)0x0) {
        p_Var20 = (_Hash_node_base *)local_198._16_8_;
        do {
          ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
          emplace_back<unsigned_long_const&>
                    ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_218
                     ,(unsigned_long *)(p_Var20 + 1));
          p_Var20 = p_Var20->_M_nxt;
        } while (p_Var20 != (_Hash_node_base *)0x0);
      }
      pSVar21 = local_218.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar7 = local_218.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar24 = (long)local_218.
                       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_218.
                       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar6 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_218.
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_218.
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        ::std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pSVar7,pSVar21);
      }
      pSVar7 = local_218.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_218.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar21 = local_218.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar19 = pSVar21->index;
          uVar24 = (ulong)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          if (uVar24 <= uVar19) {
            pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
            local_118._0_8_ = local_118 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"Attempted to access index %ld within vector of size %ld"
                       ,"");
            InternalException::InternalException<unsigned_long,unsigned_long>
                      (pIVar18,(string *)local_118,uVar19,uVar24);
            __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar24 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar24 = uVar19;
          }
          local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar24 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar24 >> 6) +
                  ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar19 & 0x3f);
          pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)&local_1f0,uVar19);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_1d8,pvVar15);
          pSVar21 = pSVar21 + 1;
        } while (pSVar21 != pSVar7);
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_198);
    }
    this_00 = (DataChunk *)(pLVar3 + 1);
    DataChunk::Reset(this_00);
    Vector::Flatten(row_identifiers,chunk->count);
    DataChunk::DataChunk(&local_c8);
    allocator = Allocator::Get(context->client);
    DataChunk::Initialize
              (&local_c8,allocator,(vector<duckdb::LogicalType,_true> *)&local_1d8,chunk->count);
    local_118._0_8_ = &local_e8;
    local_118._16_8_ = (_Hash_node_base *)0x0;
    local_118._24_8_ = 0;
    local_118._8_8_ = 1;
    local_f8._M_max_load_factor = 1.0;
    local_f8._4_4_ = 0;
    local_f8._M_next_resize = 0;
    local_e8 = (__node_base_ptr)0x0;
    vStack_e0.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_e0.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_e0.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataTable::Fetch(this->table,transaction,&local_c8,
                     (vector<duckdb::StorageIndex,_true> *)&local_218,row_identifiers,chunk->count,
                     (ColumnFetchState *)local_118);
    __n = 0;
    uVar24 = 0;
    while( true ) {
      iVar13 = DataTable::ColumnCount(this->table);
      if (iVar13 <= uVar24) break;
      uVar19 = (ulong)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      if (uVar19 <= uVar24) {
        pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
        local_198._0_8_ = local_198 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"Attempted to access index %ld within vector of size %ld","")
        ;
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (pIVar18,(string *)local_198,uVar24,uVar19);
        __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar19 = uVar24 + 0x3f;
      if (-1 < (long)uVar24) {
        uVar19 = uVar24;
      }
      if ((local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar19 >> 6) + ((ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar24 & 0x3f) & 1) == 0) {
        pvVar14 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)this_00,uVar24);
        pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)&local_1f0,uVar24);
        LogicalType::LogicalType(&local_48,pvVar15);
        Value::Value((Value *)local_198,&local_48);
        Vector::Reference(pvVar14,(Value *)local_198);
        Value::~Value((Value *)local_198);
        LogicalType::~LogicalType(&local_48);
      }
      else {
        pvVar14 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)this_00,uVar24);
        other = vector<duckdb::Vector,_true>::operator[](&local_c8.data,__n);
        Vector::Reference(pvVar14,other);
        __n = __n + 1;
      }
      uVar24 = uVar24 + 1;
    }
    pLVar3[1].partition_info.partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8.count;
    if ((pGVar2[5].state & (pointer)local_c8.count != (pointer)0x0) != READY) {
      pLVar16 = LocalStorage::Get(context->client,this->table->db);
      local_1b0 = LocalStorage::GetStorage(pLVar16,this->table);
      local_1a8.append_mode = IGNORE_DUPLICATES;
      local_1a8.delete_index.ptr = (BoundIndex *)0x0;
      optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_1b0);
      oVar8.ptr = local_1b0.ptr;
      local_200 = (pthread_mutex_t *)&(local_1b0.ptr)->delete_indexes;
      iVar10 = pthread_mutex_lock(local_200);
      if (iVar10 != 0) {
        ::std::__throw_system_error(iVar10);
      }
      puVar22 = ((oVar8.ptr)->delete_indexes).indexes.
                super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = ((oVar8.ptr)->delete_indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar22 != puVar4) {
        do {
          this_01 = (BoundIndex *)
                    unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (puVar22);
          iVar10 = (*(this_01->super_Index)._vptr_Index[2])(this_01);
          if ((char)iVar10 != '\0') {
            iVar10 = (*(this_01->super_Index)._vptr_Index[5])(this_01);
            if ((byte)((char)iVar10 - 1U) < 2) {
              BoundIndex::Append((ErrorData *)local_198,this_01,this_00,row_identifiers,&local_1a8);
              if (local_198[0] == (allocator_type)0x1) {
                pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,"failed to update delete ART in physical delete: ",""
                          );
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_88,auStack_180._16_8_,
                           (undefined1 *)
                           ((long)&peStack_168->_vptr_ExtraValueInfo + auStack_180._16_8_));
                InternalException::InternalException<std::__cxx11::string>
                          (pIVar18,&local_68,&local_88);
                __cxa_throw(pIVar18,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(local_150);
              if ((undefined1 *)auStack_180._16_8_ != local_160) {
                operator_delete((void *)auStack_180._16_8_);
              }
              if ((element_type *)local_198._8_8_ != (element_type *)auStack_180) {
                operator_delete((void *)local_198._8_8_);
              }
            }
          }
          puVar22 = puVar22 + 1;
        } while (puVar22 != puVar4);
      }
      pthread_mutex_unlock(local_200);
    }
    if (*local_1b8 == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)
                 &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                  __list.__next,this_00);
    }
    pDVar5 = this->table;
    pTVar17 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
              ::operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                           *)&pLVar3[2].partition_info.min_batch_index);
    iVar13 = DataTable::Delete(pDVar5,pTVar17,context->client,row_identifiers,chunk->count);
    p_Var1 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + iVar13);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ::~vector(&vStack_e0);
    ::std::
    _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_118);
    DataChunk::~DataChunk(&local_c8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1d8);
    ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_218);
    if (local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_240.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1f0);
  }
  pthread_mutex_unlock(local_1f8);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalDelete::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g_state = input.global_state.Cast<DeleteGlobalState>();
	auto &l_state = input.local_state.Cast<DeleteLocalState>();

	auto &transaction = DuckTransaction::Get(context.client, table.db);
	auto &row_ids = chunk.data[row_id_index];

	lock_guard<mutex> delete_guard(g_state.delete_lock);
	if (!return_chunk && !g_state.has_unique_indexes) {
		g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
		return SinkResultType::NEED_MORE_INPUT;
	}

	auto types = table.GetTypes();
	auto to_be_fetched = vector<bool>(types.size(), return_chunk);
	vector<StorageIndex> column_ids;
	vector<LogicalType> column_types;
	if (return_chunk) {
		// Fetch all columns.
		column_types = types;
		for (idx_t i = 0; i < table.ColumnCount(); i++) {
			column_ids.emplace_back(i);
		}

	} else {
		// Fetch only the required columns for updating the delete indexes.
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		unordered_set<column_t> indexed_column_id_set;
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &set = index.GetColumnIdSet();
			indexed_column_id_set.insert(set.begin(), set.end());
			return false;
		});
		for (auto &col : indexed_column_id_set) {
			column_ids.emplace_back(col);
		}
		sort(column_ids.begin(), column_ids.end());
		for (auto &col : column_ids) {
			auto i = col.GetPrimaryIndex();
			to_be_fetched[i] = true;
			column_types.push_back(types[i]);
		}
	}

	l_state.delete_chunk.Reset();
	row_ids.Flatten(chunk.size());

	// Fetch the to-be-deleted chunk.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(Allocator::Get(context.client), column_types, chunk.size());
	auto fetch_state = ColumnFetchState();
	table.Fetch(transaction, fetch_chunk, column_ids, row_ids, chunk.size(), fetch_state);

	// Reference the necessary columns of the fetch_chunk.
	idx_t fetch_idx = 0;
	for (idx_t i = 0; i < table.ColumnCount(); i++) {
		if (to_be_fetched[i]) {
			l_state.delete_chunk.data[i].Reference(fetch_chunk.data[fetch_idx++]);
			continue;
		}
		l_state.delete_chunk.data[i].Reference(Value(types[i]));
	}
	l_state.delete_chunk.SetCardinality(fetch_chunk);

	// Append the deleted row IDs to the delete indexes.
	// If we only delete local row IDs, then the delete_chunk is empty.
	if (g_state.has_unique_indexes && l_state.delete_chunk.size() != 0) {
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		IndexAppendInfo index_append_info(IndexAppendMode::IGNORE_DUPLICATES, nullptr);
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &bound_index = index.Cast<BoundIndex>();
			auto error = bound_index.Append(l_state.delete_chunk, row_ids, index_append_info);
			if (error.HasError()) {
				throw InternalException("failed to update delete ART in physical delete: ", error.Message());
			}
			return false;
		});
	}

	// Append the return_chunk to the return collection.
	if (return_chunk) {
		g_state.return_collection.Append(l_state.delete_chunk);
	}

	g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
	return SinkResultType::NEED_MORE_INPUT;
}